

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall capnp::_::ListReader::asRawBytes(ListReader *this)

{
  uchar *ptr;
  unsigned_long uVar1;
  ByteCount64 size;
  Fault local_28;
  Fault f;
  ListReader *this_local;
  
  f.exception = (Exception *)this;
  if (this->structPointerCount == 0) {
    ptr = this->ptr;
    uVar1 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
    size = WireHelpers::roundBitsUpToBytes(uVar1 * this->structDataSize);
    _this_local = arrayPtr<unsigned_long,unsigned_char>(ptr,size);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc20,FAILED,"structPointerCount == ZERO * POINTERS",
               "\"Expected data only, got pointers.\"",
               (char (*) [34])"Expected data only, got pointers.");
    kj::ArrayPtr<const_unsigned_char>::ArrayPtr((ArrayPtr<const_unsigned_char> *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return _this_local;
}

Assistant:

kj::ArrayPtr<const byte> ListReader::asRawBytes() const {
  KJ_REQUIRE(structPointerCount == ZERO * POINTERS,
             "Expected data only, got pointers.") {
    return kj::ArrayPtr<const byte>();
  }

  return arrayPtr(reinterpret_cast<const byte*>(ptr),
      WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(elementCount) * (structDataSize / ELEMENTS)));
}